

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

optional<tinyusdz::value::matrix4f> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::matrix4f>
          (optional<tinyusdz::value::matrix4f> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  PrimVar *this_00;
  matrix4f value;
  optional<tinyusdz::value::matrix4f> local_64;
  
  this_00 = &this->_var;
  bVar1 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar1) {
    local_64.has_value_ = false;
    local_64._1_3_ = 0x3f8000;
    local_64.contained._0_8_ = 0;
    local_64.contained._8_4_ = 0;
    local_64.contained._12_4_ = 0;
    local_64.contained._16_4_ = 0x3f800000;
    local_64.contained._20_4_ = 0;
    local_64.contained._24_4_ = 0;
    local_64.contained._28_4_ = 0;
    local_64.contained._32_4_ = 0;
    local_64.contained._36_4_ = 0x3f800000;
    local_64.contained._40_4_ = 0;
    local_64.contained._44_4_ = 0;
    local_64.contained._48_4_ = 0;
    local_64.contained._52_4_ = 0;
    local_64.contained._56_4_ = 0x3f800000;
    bVar1 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix4f>
                      (this_00,t,interp,(matrix4f *)&local_64);
    if (bVar1) {
      __return_storage_ptr__->has_value_ = true;
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x30) =
           CONCAT44(local_64.contained._48_4_,local_64.contained._44_4_);
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x38) =
           CONCAT44(local_64.contained._56_4_,local_64.contained._52_4_);
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x20) =
           CONCAT44(local_64.contained._32_4_,local_64.contained._28_4_);
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x28) =
           CONCAT44(local_64.contained._40_4_,local_64.contained._36_4_);
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x10) =
           CONCAT44(local_64.contained._16_4_,local_64.contained._12_4_);
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x18) =
           CONCAT44(local_64.contained._24_4_,local_64.contained._20_4_);
    }
    else {
      __return_storage_ptr__->has_value_ = false;
      local_64.has_value_ = false;
      local_64._1_3_ = 0;
      local_64.contained.data.__align = (anon_struct_4_0_00000001_for___align)0x0;
      local_64.contained._4_4_ = 0;
      local_64.contained._8_4_ = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    }
    *(undefined4 *)&__return_storage_ptr__->contained = local_64._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 4) = local_64.contained.data.__align;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_64.contained._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0xc) = local_64.contained._8_4_;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::matrix4f>(&local_64,this_00);
    __return_storage_ptr__->has_value_ = local_64.has_value_;
    if (local_64.has_value_ == true) {
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x30) =
           CONCAT44(local_64.contained._52_4_,local_64.contained._48_4_);
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x38) =
           CONCAT44(local_64.contained._60_4_,local_64.contained._56_4_);
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x20) =
           CONCAT44(local_64.contained._36_4_,local_64.contained._32_4_);
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x28) =
           CONCAT44(local_64.contained._44_4_,local_64.contained._40_4_);
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x10) =
           CONCAT44(local_64.contained._20_4_,local_64.contained._16_4_);
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x18) =
           CONCAT44(local_64.contained._28_4_,local_64.contained._24_4_);
      *(undefined8 *)&__return_storage_ptr__->contained = local_64.contained._0_8_;
      *(ulong *)((long)&__return_storage_ptr__->contained + 8) =
           CONCAT44(local_64.contained._12_4_,local_64.contained._8_4_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }